

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O2

int __thiscall
skiwi::environment<skiwi::environment_entry>::remove
          (environment<skiwi::environment_entry> *this,char *__filename)

{
  int extraout_EAX;
  iterator iVar1;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> p_outer_copy;
  __shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
                  *)this,(key_type *)__filename);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->env)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,skiwi::environment_entry>,std::_Select1st<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,skiwi::environment_entry>,std::_Select1st<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
                        *)this,iVar1);
  }
  std::__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_28,
               &(this->p_outer).
                super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
              );
  while (local_28._M_ptr != (element_type *)0x0) {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
                    *)local_28._M_ptr,(key_type *)__filename);
    if ((_Rb_tree_header *)iVar1._M_node !=
        &((local_28._M_ptr)->env)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,skiwi::environment_entry>,std::_Select1st<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,skiwi::environment_entry>,std::_Select1st<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
                          *)local_28._M_ptr,iVar1);
    }
    std::__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&local_28,
              &((local_28._M_ptr)->p_outer).
               super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
             );
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return extraout_EAX;
}

Assistant:

void remove(const std::string& name)
      {
      auto it = env.find(name);
      if (it != env.end())
        {
        env.erase(it);
        }
      //if (p_outer)
      //  p_outer->remove(name);
      auto p_outer_copy = p_outer;
      while (p_outer_copy)
        {
        it = p_outer_copy->env.find(name);
        if (it != p_outer_copy->env.end())
          {
          p_outer_copy->env.erase(it);
          }
        p_outer_copy = p_outer_copy->p_outer;
        }
      }